

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O3

String __thiscall Bstrlib::String::midString(String *this,int left,int len)

{
  uint in_ECX;
  uchar *extraout_RDX;
  uchar *extraout_RDX_00;
  uchar *puVar1;
  undefined4 in_register_00000034;
  long lVar2;
  int iVar3;
  String SVar4;
  tagbstring t;
  tagbstring local_18;
  
  lVar2 = CONCAT44(in_register_00000034,left);
  if ((int)in_ECX < 0) {
    iVar3 = *(int *)(lVar2 + 4);
    if (iVar3 == -in_ECX || SBORROW4(iVar3,-in_ECX) != (int)(iVar3 + in_ECX) < 0) {
      len = 0;
    }
    else if (len < 0) {
      len = len + iVar3;
      if (len < 1) {
        len = 0;
      }
      in_ECX = (in_ECX + iVar3) - len;
    }
    else {
      in_ECX = in_ECX + iVar3;
    }
  }
  else if (len < 0) {
    if ((uint)-len <= in_ECX) {
      in_ECX = -len;
    }
    iVar3 = *(int *)(lVar2 + 4);
    len = len + iVar3;
  }
  else {
    iVar3 = *(int *)(lVar2 + 4);
  }
  local_18.slen = iVar3 - len;
  if ((int)in_ECX < iVar3 - len) {
    local_18.slen = in_ECX;
  }
  if ((len < 0) || (local_18.slen < 1)) {
    String(this,"");
    puVar1 = extraout_RDX_00;
  }
  else {
    local_18.mlen = -1;
    local_18.data = (uchar *)((ulong)(uint)len + *(long *)(lVar2 + 8));
    String(this,&local_18);
    puVar1 = extraout_RDX;
  }
  SVar4.super_tagbstring.data = puVar1;
  SVar4.super_tagbstring._0_8_ = this;
  return (String)SVar4.super_tagbstring;
}

Assistant:

const String String::midString(int left, int len) const
    {
        struct tagbstring t;
        if (len < 0)
        {   // Want data from the right of the string, without specifying the start point
            // For example String("abcdefgh").midString(0, -3) => "abcde"
            if (-len >= slen) left = 0;
            else
            {   // Check for String("abcdef").midString(-3, -1) => "de"
                if (left < 0) { left = max(0, slen + left); len = slen + len - left; }
                else len += slen;
            }
        }
        if (left < 0)
        {   // Want data from the right of the string
            len = len > -left ? -left : len;
            left = slen + left;
        }
        if (len > slen - left)    len = slen - left;
        if (len <= 0 || left < 0)    return String("");
        blk2tbstr(t, data + left, len);
        return String(t);
    }